

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer_block.cpp
# Opt level: O1

void __thiscall
cppnet::BufferBlock::BufferBlock(BufferBlock *this,shared_ptr<cppnet::BlockMemoryPool> *alloter)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  char *pcVar2;
  int iVar3;
  uint uVar4;
  undefined4 extraout_var;
  
  (this->super_ListSlot<cppnet::BufferBlock>)._prev.
  super___weak_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->super_ListSlot<cppnet::BufferBlock>)._prev.
  super___weak_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_ListSlot<cppnet::BufferBlock>)._next.
  super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->super_ListSlot<cppnet::BufferBlock>)._next.
  super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_InnerBuffer).super_Buffer._vptr_Buffer = (_func_int **)&PTR__BufferBlock_00125b48;
  (this->super_ListSlot<cppnet::BufferBlock>)._vptr_ListSlot =
       (_func_int **)&PTR__BufferBlock_00125bd8;
  this->_can_read = false;
  (this->_alloter).super___weak_ptr<cppnet::BlockMemoryPool,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (alloter->super___shared_ptr<cppnet::BlockMemoryPool,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var1 = (alloter->super___shared_ptr<cppnet::BlockMemoryPool,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
  (this->_alloter).super___weak_ptr<cppnet::BlockMemoryPool,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_weak_count = p_Var1->_M_weak_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_weak_count = p_Var1->_M_weak_count + 1;
    }
  }
  iVar3 = (*((alloter->super___shared_ptr<cppnet::BlockMemoryPool,_(__gnu_cxx::_Lock_policy)2>).
            _M_ptr)->_vptr_BlockMemoryPool[2])();
  this->_buffer_start = (char *)CONCAT44(extraout_var,iVar3);
  uVar4 = (*((alloter->super___shared_ptr<cppnet::BlockMemoryPool,_(__gnu_cxx::_Lock_policy)2>).
            _M_ptr)->_vptr_BlockMemoryPool[5])();
  this->_total_size = uVar4;
  pcVar2 = this->_buffer_start;
  this->_buffer_end = pcVar2 + uVar4;
  this->_write = pcVar2;
  this->_read = pcVar2;
  return;
}

Assistant:

BufferBlock::BufferBlock(std::shared_ptr<BlockMemoryPool>& alloter) : 
    _can_read(false),
    _alloter(alloter) {

    _buffer_start = (char*)alloter->PoolLargeMalloc();
    _total_size = alloter->GetBlockLength();
    _buffer_end = _buffer_start + _total_size;
    _read = _write = _buffer_start;
}